

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.c
# Opt level: O1

void BrotliCreateBackwardReferences
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  int iVar1;
  
  iVar1 = (params->hasher).type;
  if (iVar1 < 0x28) {
    switch(iVar1) {
    case 2:
      CreateBackwardReferencesNH2
                (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
                 last_insert_len,commands,num_commands,num_literals);
      break;
    case 3:
      CreateBackwardReferencesNH3
                (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
                 last_insert_len,commands,num_commands,num_literals);
      break;
    case 4:
      CreateBackwardReferencesNH4
                (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
                 last_insert_len,commands,num_commands,num_literals);
      break;
    case 5:
      CreateBackwardReferencesNH5
                (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
                 last_insert_len,commands,num_commands,num_literals);
      break;
    case 6:
      CreateBackwardReferencesNH6
                (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
                 last_insert_len,commands,num_commands,num_literals);
    }
  }
  else if (iVar1 < 0x2a) {
    if (iVar1 == 0x28) {
      CreateBackwardReferencesNH40
                (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
                 last_insert_len,commands,num_commands,num_literals);
    }
    else if (iVar1 == 0x29) {
      CreateBackwardReferencesNH41
                (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
                 last_insert_len,commands,num_commands,num_literals);
    }
  }
  else if (iVar1 == 0x2a) {
    CreateBackwardReferencesNH42
              (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
               last_insert_len,commands,num_commands,num_literals);
  }
  else if (iVar1 == 0x36) {
    CreateBackwardReferencesNH54
              (num_bytes,position,ringbuffer,ringbuffer_mask,params,hasher,dist_cache,
               last_insert_len,commands,num_commands,num_literals);
    return;
  }
  return;
}

Assistant:

void BrotliCreateBackwardReferences(
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  switch (params->hasher.type) {
#define CASE_(N)                                                  \
    case N:                                                       \
      CreateBackwardReferencesNH ## N(                            \
          num_bytes, position, ringbuffer,                        \
          ringbuffer_mask, params, hasher, dist_cache,            \
          last_insert_len, commands, num_commands, num_literals); \
      return;
    FOR_GENERIC_HASHERS(CASE_)
#undef CASE_
    default:
      break;
  }
}